

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaptexture.cpp
# Opt level: O3

void __thiscall FAutomapTexture::MakeTexture(FAutomapTexture *this)

{
  ushort uVar1;
  FString in_RAX;
  BYTE *pBVar2;
  ulong uVar3;
  FResourceFile **ppFVar4;
  ulong uVar5;
  FMemLump FVar6;
  ulong uVar7;
  FMemLump data;
  FMemLump local_28;
  
  local_28.Block.Chars = (FString)(FString)in_RAX.Chars;
  FWadCollection::ReadLump((FWadCollection *)&stack0xffffffffffffffd8,0xaad1d0);
  FVar6.Block.Chars = (FString)(FString)(FResourceFile **)0x0;
  if (*(int *)((long)local_28.Block.Chars + -0xc) != 0) {
    FVar6.Block.Chars = local_28.Block.Chars;
  }
  uVar1 = (this->super_FTexture).Width;
  uVar5 = (ulong)uVar1;
  uVar7 = (ulong)(this->super_FTexture).Height;
  pBVar2 = (BYTE *)operator_new__(uVar7 * uVar5);
  this->Pixels = pBVar2;
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      if ((short)uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar5 = 0;
        ppFVar4 = (FResourceFile **)FVar6.Block.Chars;
        do {
          this->Pixels[uVar5 + uVar7 * uVar3] = *(BYTE *)ppFVar4;
          uVar5 = uVar5 + 1;
          uVar7 = (ulong)(this->super_FTexture).Height;
          ppFVar4 = ppFVar4 + 0x28;
        } while (uVar5 < uVar7);
        uVar5 = (ulong)(this->super_FTexture).Width;
      }
      uVar3 = uVar3 + 1;
      FVar6.Block.Chars = (FString)((long)FVar6.Block.Chars + 1);
    } while (uVar3 < uVar5);
  }
  FMemLump::~FMemLump(&stack0xffffffffffffffd8);
  return;
}

Assistant:

void FAutomapTexture::MakeTexture ()
{
	int x, y;
	FMemLump data = Wads.ReadLump (SourceLump);
	const BYTE *indata = (const BYTE *)data.GetMem();

	Pixels = new BYTE[Width * Height];

	for (x = 0; x < Width; ++x)
	{
		for (y = 0; y < Height; ++y)
		{
			Pixels[x*Height+y] = indata[x+320*y];
		}
	}
}